

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

int process_boundaries(vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_> *current_boundaries,
                      map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                      *poly_map_destination)

{
  uint uVar1;
  size_type sVar2;
  mapped_type *this;
  pointer pgVar3;
  vector<co_ord,_std::allocator<co_ord>_> new_vector;
  co_ord temp_co;
  vector<co_ord,_std::allocator<co_ord>_> local_a8;
  pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_88;
  value_type local_68;
  
  pgVar3 = (current_boundaries->super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_68.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  for (; pgVar3 != (current_boundaries->
                   super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pgVar3 = pgVar3 + 1) {
    uVar1 = pgVar3->layer;
    std::vector<int,_std::allocator<int>_>::operator=(&local_68.x,&pgVar3->xCor);
    std::vector<int,_std::allocator<int>_>::operator=(&local_68.y,&pgVar3->yCor);
    local_88.first = uVar1;
    sVar2 = std::
            map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
            ::count(poly_map_destination,&local_88.first);
    if (sVar2 == 0) {
      local_a8.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_a8.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_a8.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back(&local_a8,&local_68);
      std::pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
      pair<unsigned_int_&,_std::vector<co_ord,_std::allocator<co_ord>_>_&,_true>
                (&local_88,&pgVar3->layer,&local_a8);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
      ::_M_emplace_unique<std::pair<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
                  *)poly_map_destination,&local_88);
      std::vector<co_ord,_std::allocator<co_ord>_>::~vector(&local_88.second);
      std::vector<co_ord,_std::allocator<co_ord>_>::~vector(&local_a8);
    }
    else {
      local_88.first = uVar1;
      this = std::
             map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
             ::operator[](poly_map_destination,&local_88.first);
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back(this,&local_68);
    }
  }
  co_ord::~co_ord(&local_68);
  return 0;
}

Assistant:

int process_boundaries(vector<gdsBOUNDARY> &current_boundaries,
                       map<unsigned int, vector<co_ord>> &poly_map_destination)
{
  auto bound_iter = current_boundaries.begin();
  int key = 0;
  co_ord temp_co;
  while (bound_iter != current_boundaries.end()) {
    key = bound_iter->layer;
    temp_co.x = bound_iter->xCor;
    temp_co.y = bound_iter->yCor;
    if (poly_map_destination.count(key) > 0) // append
    {
      poly_map_destination[key].push_back(temp_co);
    } else {
      vector<co_ord> new_vector;
      new_vector.push_back(temp_co);
      poly_map_destination.insert(
          pair<unsigned int, vector<co_ord>>(bound_iter->layer, new_vector));
    }
    bound_iter++;
  }
  return EXIT_SUCCESS;
}